

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_test.cpp
# Opt level: O0

void __thiscall QuadDrawer::render(QuadDrawer *this)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  int local_220 [12];
  Vector3D local_1f0;
  Matrix3x3 local_1d8;
  undefined1 local_190 [8];
  Vector3D d_trans;
  Matrix3x3 local_160;
  undefined1 local_118 [8];
  Vector3D c_trans;
  Matrix3x3 local_e8;
  undefined1 local_a0 [8];
  Vector3D b_trans;
  Matrix3x3 local_70;
  undefined1 local_28 [8];
  Vector3D a_trans;
  QuadDrawer *this_local;
  
  a_trans.z = (double)this;
  glBindTexture(0xde1,texture);
  glBegin(7);
  glColor3f(0x3f800000,0x3f800000,0);
  CGL::Matrix3x3::Matrix3x3(&local_70,&this->mat);
  CGL::Vector3D::Vector3D((Vector3D *)&b_trans.z,&this->a);
  mult((Vector3D *)local_28,&local_70,(Vector3D *)&b_trans.z);
  CGL::Matrix3x3::Matrix3x3(&local_e8,&this->mat);
  CGL::Vector3D::Vector3D((Vector3D *)&c_trans.z,&this->b);
  mult((Vector3D *)local_a0,&local_e8,(Vector3D *)&c_trans.z);
  CGL::Matrix3x3::Matrix3x3(&local_160,&this->mat);
  CGL::Vector3D::Vector3D((Vector3D *)&d_trans.z,&this->c);
  mult((Vector3D *)local_118,&local_160,(Vector3D *)&d_trans.z);
  CGL::Matrix3x3::Matrix3x3(&local_1d8,&this->mat);
  CGL::Vector3D::Vector3D(&local_1f0,&this->d);
  mult((Vector3D *)local_190,&local_1d8,&local_1f0);
  glTexCoord2f(0);
  local_220[0xb] = 0;
  pdVar3 = CGL::Vector3D::operator[]((Vector3D *)local_28,local_220 + 0xb);
  dVar1 = *pdVar3;
  local_220[10] = 1;
  pdVar3 = CGL::Vector3D::operator[]((Vector3D *)local_28,local_220 + 10);
  dVar2 = *pdVar3;
  local_220[9] = 2;
  pdVar3 = CGL::Vector3D::operator[]((Vector3D *)local_28,local_220 + 9);
  glVertex3f((float)dVar1,(float)dVar2,CONCAT44((int)((ulong)*pdVar3 >> 0x20),(float)*pdVar3));
  glTexCoord2f(0,0x3f800000);
  local_220[8] = 0;
  pdVar3 = CGL::Vector3D::operator[]((Vector3D *)local_a0,local_220 + 8);
  dVar1 = *pdVar3;
  local_220[7] = 1;
  pdVar3 = CGL::Vector3D::operator[]((Vector3D *)local_a0,local_220 + 7);
  dVar2 = *pdVar3;
  local_220[6] = 2;
  pdVar3 = CGL::Vector3D::operator[]((Vector3D *)local_a0,local_220 + 6);
  glVertex3f((float)dVar1,(float)dVar2,CONCAT44((int)((ulong)*pdVar3 >> 0x20),(float)*pdVar3));
  glTexCoord2f(0x3f800000);
  local_220[5] = 0;
  pdVar3 = CGL::Vector3D::operator[]((Vector3D *)local_118,local_220 + 5);
  dVar1 = *pdVar3;
  local_220[4] = 1;
  pdVar3 = CGL::Vector3D::operator[]((Vector3D *)local_118,local_220 + 4);
  dVar2 = *pdVar3;
  local_220[3] = 2;
  pdVar3 = CGL::Vector3D::operator[]((Vector3D *)local_118,local_220 + 3);
  glVertex3f((float)dVar1,(float)dVar2,CONCAT44((int)((ulong)*pdVar3 >> 0x20),(float)*pdVar3));
  glTexCoord2f(0x3f800000,0);
  local_220[2] = 0;
  pdVar3 = CGL::Vector3D::operator[]((Vector3D *)local_190,local_220 + 2);
  dVar1 = *pdVar3;
  local_220[1] = 1;
  pdVar3 = CGL::Vector3D::operator[]((Vector3D *)local_190,local_220 + 1);
  dVar2 = *pdVar3;
  local_220[0] = 2;
  pdVar3 = CGL::Vector3D::operator[]((Vector3D *)local_190,local_220);
  glVertex3f((float)dVar1,(float)dVar2,CONCAT44((int)((ulong)*pdVar3 >> 0x20),(float)*pdVar3));
  glDeleteTextures(1,&texture);
  glDisable(0xde1);
  glEnd();
  return;
}

Assistant:

void render() {
    glBindTexture(GL_TEXTURE_2D, texture); // Comment this out to disable textures
    glBegin(GL_QUADS);

    glColor3f( 1.0, 1.0, 0.0); // Can play with RGB values here :)

    Vector3D a_trans = mult(mat, a);
    Vector3D b_trans = mult(mat, b);
    Vector3D c_trans = mult(mat, c);
    Vector3D d_trans = mult(mat, d);
      
    glTexCoord2f(0,0);
    glVertex3f(a_trans[0], a_trans[1], a_trans[2]);
    /* TODO: change the (0,1) below to (0,.1) to zoom into the texture to see changes. */
    glTexCoord2f(0,1);
    glVertex3f(b_trans[0], b_trans[1], b_trans[2]);
    /* TODO: change the (1,1) below to (.1,.1) to zoom into the texture to see changes. */
    glTexCoord2f(1,1);
    glVertex3f(c_trans[0], c_trans[1], c_trans[2]);
    /* TODO: change the (1,0) to (.1,0) to zoom into the texture to see changes. */
    glTexCoord2f(1,0);
    glVertex3f(d_trans[0], d_trans[1], d_trans[2]);
    glDeleteTextures(1, &texture);
    glDisable(GL_TEXTURE_2D);
    glEnd();
  }